

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O0

enum_<kratos::AuxiliaryType> * __thiscall
pybind11::enum_<kratos::AuxiliaryType>::value
          (enum_<kratos::AuxiliaryType> *this,char *name,AuxiliaryType value,char *doc)

{
  handle local_38;
  object local_30;
  char *local_28;
  char *doc_local;
  char *pcStack_18;
  AuxiliaryType value_local;
  char *name_local;
  enum_<kratos::AuxiliaryType> *this_local;
  
  local_38.m_ptr = (PyObject *)0x0;
  local_28 = doc;
  doc_local._4_4_ = value;
  pcStack_18 = name;
  name_local = (char *)this;
  pybind11::handle::handle(&local_38);
  cast<kratos::AuxiliaryType_&,_0>
            ((pybind11 *)&local_30,(AuxiliaryType *)((long)&doc_local + 4),copy,local_38);
  pybind11::detail::enum_base::value(&this->m_base,name,&local_30,local_28);
  object::~object(&local_30);
  return this;
}

Assistant:

enum_& value(char const* name, Type value, const char *doc = nullptr) {
        m_base.value(name, pybind11::cast(value, return_value_policy::copy), doc);
        return *this;
    }